

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::write_websocket_close(coro_http_client *this,string *msg)

{
  long *plVar1;
  size_t sVar2;
  element_type *peVar3;
  long *in_RDX;
  char **ppcVar4;
  
  peVar3 = (element_type *)operator_new(0xe8,(nothrow_t *)&std::nothrow);
  if (peVar3 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar3->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         write_websocket_close;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar3->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)write_websocket_close;
    ((string_view *)((long)(peVar3->parser_).headers_._M_elems + 0x90))->_M_len = (size_t)msg;
    ppcVar4 = (char **)((long)(peVar3->parser_).headers_._M_elems + 0x68);
    *(char ***)((long)(peVar3->parser_).headers_._M_elems + 0x58) = ppcVar4;
    plVar1 = in_RDX + 2;
    if ((long *)*in_RDX == plVar1) {
      sVar2 = in_RDX[3];
      *ppcVar4 = (char *)*plVar1;
      ((string_view *)((long)(peVar3->parser_).headers_._M_elems + 0x70))->_M_len = sVar2;
    }
    else {
      *(char **)((long)(peVar3->parser_).headers_._M_elems + 0x58) = (char *)*in_RDX;
      *(char **)((long)(peVar3->parser_).headers_._M_elems + 0x68) = (char *)*plVar1;
    }
    (((http_header *)((long)(peVar3->parser_).headers_._M_elems + 0x60))->name)._M_len = in_RDX[1];
    *in_RDX = (long)plVar1;
    in_RDX[1] = 0;
    *(undefined1 *)(in_RDX + 2) = 0;
    (peVar3->parser_).msg_._M_str = (char *)0x0;
    *(undefined8 *)&peVar3->parser_ = 0;
    (peVar3->parser_).msg_._M_len = 0;
    *(undefined1 *)((long)(peVar3->parser_).headers_._M_elems + 0x18) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    *(undefined1 *)((long)(peVar3->parser_).headers_._M_elems + 0x98) = 0;
  }
  return (LazyBase<cinatra::resp_data,_false>)(LazyBase<cinatra::resp_data,_false>)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> write_websocket_close(
      std::string msg = "") {
    co_return co_await write_websocket(std::move(msg), opcode::close);
  }